

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestDollars::Run(ParserTestDollars *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  reference ppEVar5;
  string local_90;
  allocator<char> local_59;
  string local_58;
  string local_38;
  int local_14;
  ParserTestDollars *pPStack_10;
  int fail_count;
  ParserTestDollars *this_local;
  
  pPStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule foo\n  command = ${out}bar$$baz$$$\nblah\nx = $$dollar\nbuild $x: foo y\n");
  iVar2 = local_14;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"x",&local_59);
    BindingEnv::LookupVariable(&local_38,&(this->super_ParserTest).state.bindings_,&local_58);
    bVar3 = std::operator==("$dollar",&local_38);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0xe3,"\"$dollar\" == state.bindings_.LookupVariable(\"x\")");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    pTVar1 = g_current_test;
    ppEVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                        (&(this->super_ParserTest).state.edges_,0);
    Edge::EvaluateCommand_abi_cxx11_(&local_90,*ppEVar5,false);
    bVar3 = std::operator==("\'$dollar\'bar$baz$blah",&local_90);
    testing::Test::Check
              (pTVar1,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
               ,0xe7,"\"\'$dollar\'bar$baz$blah\" == state.edges_[0]->EvaluateCommand()");
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, Dollars) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule foo\n"
"  command = ${out}bar$$baz$$$\n"
"blah\n"
"x = $$dollar\n"
"build $x: foo y\n"
));
  EXPECT_EQ("$dollar", state.bindings_.LookupVariable("x"));
#ifdef _WIN32
  EXPECT_EQ("$dollarbar$baz$blah", state.edges_[0]->EvaluateCommand());
#else
  EXPECT_EQ("'$dollar'bar$baz$blah", state.edges_[0]->EvaluateCommand());
#endif
}